

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *value)

{
  istream *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_1;
  string token;
  stringstream in;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  byte abStack_198 [360];
  
  if (text->_M_string_length == 0) {
    _in = (pointer)&local_1a8;
    local_1a8._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&in);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)value,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in);
    std::__cxx11::string::~string((string *)&in);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)text,_S_out|_S_in);
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    while ((abStack_198[*(long *)(_in + -0x18)] & 2) == 0) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&in,(string *)&token,',');
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      v_1._M_string_length = 0;
      v_1.field_2._M_local_buf[0] = '\0';
      v_1._M_dataplus._M_p = (pointer)&v_1.field_2;
      std::__cxx11::string::_M_assign((string *)&v_1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)value,&v_1);
      std::__cxx11::string::~string((string *)&v_1);
    }
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::stringstream::~stringstream((stringstream *)&in);
  }
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      if (text.empty()) {
        T v;
        parse_value(text, v);
        value.emplace_back(std::move(v));
        return;
      }
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }